

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

double __thiscall CGL::Matrix3x3::norm(Matrix3x3 *this)

{
  Vector3D *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = Vector3D::norm2(in_RDI);
  dVar2 = Vector3D::norm2(in_RDI + 1);
  dVar3 = Vector3D::norm2(in_RDI + 2);
  dVar1 = sqrt(dVar1 + dVar2 + dVar3);
  return dVar1;
}

Assistant:

double Matrix3x3::norm( void ) const {
    return sqrt( entries[0].norm2() +
                 entries[1].norm2() +
                 entries[2].norm2() );
  }